

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EmptyPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1)

{
  EmptyPortConnectionSyntax *this_00;
  Token *in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (EmptyPortConnectionSyntax *)
            allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::syntax::EmptyPortConnectionSyntax::EmptyPortConnectionSyntax
            (this_00,in_stack_ffffffffffffffc8,*in_RDX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }